

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_selection_vec4(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle(&local_30,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::swizzle(&local_40,(int)local_10 + 0x50,0,3,2);
  sr::(anonymous_namespace)::selection<tcu::Vector<float,4>>
            ((_anonymous_namespace_ *)&local_20,0.0 < fVar1,&local_30,&local_40);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void eval_selection_vec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(3, 2, 1, 0),	c.in[2].swizzle(0, 3, 2, 1)); }